

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::UnmapTextureSubresource
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,ITexture *pTexture,Uint32 MipLevel,
          Uint32 ArraySlice)

{
  undefined4 uVar1;
  int iVar2;
  Uint32 UVar3;
  Char *pCVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  Uint32 ArraySlice_local;
  Uint32 MipLevel_local;
  ITexture *pTexture_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_4_ = ArraySlice;
  msg.field_2._12_4_ = MipLevel;
  if (pTexture == (ITexture *)0x0) {
    FormatString<char[26]>((string *)local_40,(char (*) [26])0xf4ec20);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"UnmapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x75f);
    std::__cxx11::string::~string((string *)local_40);
  }
  uVar1 = msg.field_2._12_4_;
  iVar2 = (*(pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(uint *)(CONCAT44(extraout_var,iVar2) + 0x1c) <= (uint)uVar1) {
    FormatString<char[26]>
              ((string *)((long)&msg_2.field_2 + 8),(char (*) [26])"Mip level is out of range");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"UnmapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x760);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  uVar1 = msg.field_2._8_4_;
  iVar2 = (*(pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  UVar3 = TextureDesc::GetArraySize((TextureDesc *)CONCAT44(extraout_var_00,iVar2));
  if (UVar3 <= (uint)uVar1) {
    FormatString<char[28]>((string *)local_90,(char (*) [28])"Array slice is out of range");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"UnmapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x761);
    std::__cxx11::string::~string((string *)local_90);
  }
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::UnmapTextureSubresource(
    ITexture* pTexture,
    Uint32    MipLevel,
    Uint32    ArraySlice)
{
    DEV_CHECK_ERR(pTexture, "pTexture must not be null");
    DEV_CHECK_ERR(MipLevel < pTexture->GetDesc().MipLevels, "Mip level is out of range");
    DEV_CHECK_ERR(ArraySlice < pTexture->GetDesc().GetArraySize(), "Array slice is out of range");
}